

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

void Js::JavascriptOperators::BuildHandlerScope
               (Var argThis,RecyclableObject *hostObject,FrameDisplay *pDisplay,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  JavascriptNumberObject *item;
  Var value;
  Recycler *this;
  FrameDisplay *pFVar5;
  Var item_00;
  ushort uVar6;
  Type TVar7;
  undefined1 local_90 [8];
  TrackAllocData data;
  FrameDisplay *local_40;
  
  data._32_8_ = hostObject;
  if (argThis == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1b5e,"(argThis != nullptr)","argThis != nullptr");
    if (!bVar2) goto LAB_00ac5e70;
    *puVar4 = 0;
  }
  bVar2 = VarIs<Js::RecyclableObject>(argThis);
  if (bVar2) {
    item = (JavascriptNumberObject *)ToUnscopablesWrapperObject(argThis,scriptContext);
  }
  else {
    item = JavascriptLibrary::CreateNumberObject
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,argThis);
  }
  FrameDisplay::SetItem(pDisplay,0,item);
  TVar7 = pDisplay->length;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  uVar6 = 1;
  local_40 = pDisplay;
  do {
    if (argThis == (Var)0x0) break;
    value = (Var)(**(code **)(*(long *)data._32_8_ + 0x270))(data._32_8_,argThis);
    if (value != (Var)0x0) {
      argThis = CrossSite::MarshalVar(scriptContext,value,false);
      if (uVar6 == TVar7) {
        if (0xfff7 < TVar7) {
          ::Math::DefaultOverflowPolicy();
        }
        TVar7 = TVar7 + 8;
        local_90 = (undefined1  [8])&FrameDisplay::typeinfo;
        data.plusSize = 0xffffffffffffffff;
        data.count = (size_t)anon_var_dwarf_4e9d853;
        data.filename._0_4_ = 0x1b73;
        data.typeinfo = (type_info *)((ulong)TVar7 * 8);
        this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_90);
        BVar3 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar3 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar2) goto LAB_00ac5e70;
          *puVar4 = 0;
        }
        pFVar5 = (FrameDisplay *)
                 Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                           (this,(size_t)((type_info *)((ulong)TVar7 * 8) + 8));
        if (pFVar5 == (FrameDisplay *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x20d,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar2) goto LAB_00ac5e70;
          *puVar4 = 0;
        }
        pFVar5->tag = true;
        pFVar5->strictMode = false;
        pFVar5->length = TVar7;
        pFVar5->unused = 0;
        js_memcpy_s(pFVar5 + 1,(ulong)pFVar5->length << 3,local_40 + 1,(ulong)local_40->length << 3)
        ;
        local_40 = pFVar5;
      }
      item_00 = ToUnscopablesWrapperObject(argThis,scriptContext);
      FrameDisplay::SetItem(local_40,(uint)uVar6,item_00);
      uVar6 = uVar6 + 1;
    }
  } while (value != (Var)0x0);
  if (local_40->length < uVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1b7f,"(i <= pDisplay->GetLength())","i <= pDisplay->GetLength()")
    ;
    if (!bVar2) {
LAB_00ac5e70:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_40->length = uVar6;
  return;
}

Assistant:

void JavascriptOperators::BuildHandlerScope(Var argThis, RecyclableObject * hostObject, FrameDisplay * pDisplay, ScriptContext * scriptContext)
    {
        // Event handlers need implicit lookups of @@unscopables on parent scopes.
        // We can intercept the property accesses by wrapping the object with the unscopables handler.
        // WebIDL: https://heycam.github.io/webidl/#ref-for-Unscopable

        Assert(argThis != nullptr);
        pDisplay->SetItem(0, TaggedNumber::Is(argThis) ? scriptContext->GetLibrary()->CreateNumberObject(argThis) : ToUnscopablesWrapperObject(argThis, scriptContext));
        uint16 i = 1;

        Var aChild = argThis;
        uint16 length = pDisplay->GetLength();

        // Now add any parent scopes
        // We need to support the namespace parent lookup in both fastDOM on and off scenario.
        while (aChild != NULL)
        {
            Var aParent = hostObject->GetNamespaceParent(aChild);

            if (aParent == nullptr)
            {
                break;
            }
            aParent = CrossSite::MarshalVar(scriptContext, aParent);
            if (i == length)
            {
                length = UInt16Math::Add(length, 8);
                FrameDisplay * tmp = RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(void*), FrameDisplay, length);
                js_memcpy_s((char*)tmp + tmp->GetOffsetOfScopes(), tmp->GetLength() * sizeof(void *), (char*)pDisplay + pDisplay->GetOffsetOfScopes(), pDisplay->GetLength() * sizeof(void*));
                pDisplay = tmp;
            }

            Var aParentWrapped = ToUnscopablesWrapperObject(aParent, scriptContext);
            pDisplay->SetItem(i, aParentWrapped);

            aChild = aParent;
            i++;
        }

        Assert(i <= pDisplay->GetLength());
        pDisplay->SetLength(i);
    }